

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult cmCMakePresetsGraphInternal::PresetBoolHelper(bool *out,Value *value)

{
  ReadFileResult RVar1;
  Value *local_18;
  
  if (PresetBoolHelper(bool&,Json::Value_const*)::helper == '\0') {
    PresetBoolHelper();
  }
  local_18 = value;
  if (PresetBoolHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetBoolHelper::helper._M_invoker)
                      ((_Any_data *)&PresetBoolHelper::helper,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetBoolHelper(bool& out,
                                                     const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Bool(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}